

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_0::getLastFullLevel(ImageInfo *info)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int i;
  long lVar10;
  IVec3 blockPixelSize;
  int local_48 [3];
  int local_3c;
  int local_38;
  int local_34;
  
  iVar6 = getLevelCount(info);
  getTexelBlockPixelSize((anon_unknown_0 *)&local_3c,info->m_format);
  if (0 < iVar6) {
    dVar1 = info->m_target;
    iVar2 = (info->m_size).m_data[0];
    iVar3 = (info->m_size).m_data[1];
    iVar4 = (info->m_size).m_data[2];
    iVar8 = 0;
    bVar5 = true;
    do {
      local_48[2] = 0;
      local_48[0] = 0;
      local_48[1] = 0;
      bVar7 = (byte)iVar8;
      if (dVar1 == 0x8c1a) {
        local_48[0] = iVar2 >> (bVar7 & 0x1f);
        if (local_48[0] < 2) {
          local_48[0] = 1;
        }
        local_48[1] = iVar3 >> (bVar7 & 0x1f);
        local_48[2] = iVar4;
        if (local_48[1] < 2) {
          local_48[1] = 1;
        }
      }
      else {
        lVar10 = 0;
        do {
          iVar9 = (info->m_size).m_data[lVar10] >> (bVar7 & 0x1f);
          if (iVar9 < 2) {
            iVar9 = 1;
          }
          local_48[lVar10] = iVar9;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
      }
      if (((local_48[0] < local_3c) || (local_48[1] < local_38)) || (local_48[2] < local_34)) {
        if (bVar5) {
          iVar6 = iVar8;
        }
        break;
      }
      iVar8 = iVar8 + 1;
      bVar5 = iVar8 < iVar6;
    } while (iVar8 != iVar6);
  }
  return iVar6 + -1;
}

Assistant:

int getLastFullLevel (const ImageInfo& info)
{
	const int	levelCount		= getLevelCount(info);
	const IVec3	blockPixelSize	= getTexelBlockPixelSize(info.getFormat());

	for (int level = 0; level < levelCount; level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), info.getSize(), level);

		if (levelSize.x() < blockPixelSize.x() || levelSize.y() < blockPixelSize.y() || levelSize.z() < blockPixelSize.z())
			return level - 1;
	}

	return levelCount -1;
}